

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simpletz.cpp
# Opt level: O0

void __thiscall
icu_63::SimpleTimeZone::setStartRule
          (SimpleTimeZone *this,int32_t month,int32_t dayOfMonth,int32_t dayOfWeek,int32_t time,
          TimeMode mode,UBool after,UErrorCode *status)

{
  undefined4 local_34;
  TimeMode mode_local;
  int32_t time_local;
  int32_t dayOfWeek_local;
  int32_t dayOfMonth_local;
  int32_t month_local;
  SimpleTimeZone *this_local;
  
  local_34 = dayOfMonth;
  if (after == '\0') {
    local_34 = -dayOfMonth;
  }
  setStartRule(this,month,local_34,-dayOfWeek,time,mode,status);
  return;
}

Assistant:

void 
SimpleTimeZone::setStartRule(int32_t month, int32_t dayOfMonth, int32_t dayOfWeek, 
                             int32_t time, TimeMode mode, UBool after, UErrorCode& status)
{
    setStartRule(month, after ? dayOfMonth : -dayOfMonth,
                 -dayOfWeek, time, mode, status);
}